

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PolysTestGroup::init
          (PolysTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TriangleCaseBase *pTVar1;
  TriangleData local_818;
  undefined1 *local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  TriangleData local_6f8;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  TriangleData local_5d8;
  TriangleData local_578;
  TriangleData local_518;
  TriangleData local_4b8;
  TriangleData local_458;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  TriangleData local_2d8;
  undefined1 *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  TriangleData local_1b8;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_6f8.p0.m_data[0] = -0.8;
  local_6f8.p0.m_data[1] = -0.2;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 1.0;
  local_6f8.c0.m_data[2] = 1.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = -0.8;
  local_6f8.p1.m_data[1] = 0.2;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 1.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = -1.3;
  local_6f8.p2.m_data[1] = 0.05;
  local_6f8.p2.m_data[2] = 0.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 1.0;
  local_6f8.c2.m_data[1] = 1.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999abf19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f8000003f800000;
  uStack_680 = 0x3f8000003f800000;
  local_678 = 0xbf19999abf99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f8000003f800000;
  local_658 = 0xbf19999abf19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0x3f8000003f800000;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f19999abf8ccccd;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f8000003f800000;
  uStack_620 = 0x3f8000003f800000;
  local_618 = 0x3f8ccccdbf8ccccd;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f8000003f800000;
  local_5f8 = 0x3f8ccccdbf19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0x3f8000003f800000;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = 0.8;
  local_5d8.p0.m_data[1] = 1.1;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 1.0;
  local_5d8.c0.m_data[2] = 1.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 0.95;
  local_5d8.p1.m_data[1] = -1.1;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 1.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = 3.0;
  local_5d8.p2.m_data[1] = 0.0;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_1b8.p0.m_data[0] = -0.2;
  local_1b8.p0.m_data[1] = 0.7;
  local_1b8.p0.m_data[2] = 0.0;
  local_1b8.p0.m_data[3] = 1.0;
  local_1b8.c0.m_data[0] = 1.0;
  local_1b8.c0.m_data[1] = 1.0;
  local_1b8.c0.m_data[2] = 1.0;
  local_1b8.c0.m_data[3] = 1.0;
  local_1b8.p1.m_data[0] = 0.2;
  local_1b8.p1.m_data[1] = 0.7;
  local_1b8.p1.m_data[2] = 0.0;
  local_1b8.p1.m_data[3] = 1.0;
  local_1b8.c1.m_data[0] = 1.0;
  local_1b8.c1.m_data[1] = 1.0;
  local_1b8.c1.m_data[2] = 1.0;
  local_1b8.c1.m_data[3] = 1.0;
  local_1b8.p2.m_data[0] = 0.0;
  local_1b8.p2.m_data[1] = 0.9;
  local_1b8.p2.m_data[2] = 2.0;
  local_1b8.p2.m_data[3] = 1.0;
  local_1b8.c2.m_data[0] = 1.0;
  local_1b8.c2.m_data[1] = 1.0;
  local_1b8.c2.m_data[2] = 1.0;
  local_1b8.c2.m_data[3] = 1.0;
  local_158 = 0x3ecccccd3f666666;
  uStack_150 = 0x3f800000bfc00000;
  local_148 = 0x3f8000003f800000;
  uStack_140 = 0x3f8000003f800000;
  local_138 = 0xbecccccd3f666666;
  uStack_130 = 0x3f800000bfc00000;
  local_128 = 0x3f8000003f800000;
  uStack_120 = 0x3f8000003f800000;
  local_118 = 0x3f19999a;
  uStack_110 = 0x3f80000000000000;
  local_108 = 0x3f8000003f800000;
  uStack_100 = 0x3f8000003f800000;
  local_f8 = 0x3f19999abf666666;
  uStack_f0 = 0x3f800000c0000000;
  local_e8 = 0x3f8000003f800000;
  uStack_e0 = 0x3f8000003f800000;
  local_d8 = 0xbf19999abf666666;
  uStack_d0 = 0x3f800000c0000000;
  local_c8 = 0x3f8000003f800000;
  uStack_c0 = 0x3f8000003f800000;
  local_b8 = 0xbecccccd;
  uStack_b0 = 0x3f80000040000000;
  local_a8 = 0x3f8000003f800000;
  uStack_a0 = 0x3f8000003f800000;
  local_98 = 0xbf99999a00000000;
  uStack_90 = 0x3f80000000000000;
  local_88 = 0x3f8000003f800000;
  uStack_80 = 0x3f8000003f800000;
  local_78 = 0x3f00000000000000;
  uStack_70 = 0x3f800000bfc00000;
  local_68 = 0x3f8000003f800000;
  uStack_60 = 0x3f8000003f800000;
  local_58 = 0xbf6666663f99999a;
  uStack_50 = 0x3f80000000000000;
  local_2d8.p0.m_data[0] = -0.2;
  local_2d8.p0.m_data[1] = -0.3;
  local_2d8.p0.m_data[2] = 0.0;
  local_2d8.p0.m_data[3] = 1.0;
  local_2d8.c0.m_data[0] = 1.0;
  local_2d8.c0.m_data[1] = 1.0;
  local_2d8.c0.m_data[2] = 1.0;
  local_2d8.c0.m_data[3] = 1.0;
  local_2d8.p1.m_data[0] = 0.2;
  local_2d8.p1.m_data[1] = -0.3;
  local_2d8.p1.m_data[2] = 0.0;
  local_2d8.p1.m_data[3] = 1.0;
  local_2d8.c1.m_data[0] = 1.0;
  local_2d8.c1.m_data[1] = 1.0;
  local_2d8.c1.m_data[2] = 1.0;
  local_2d8.c1.m_data[3] = 1.0;
  local_2d8.p2.m_data[0] = 0.0;
  local_2d8.p2.m_data[1] = -100000.0;
  local_2d8.p2.m_data[2] = 2.0;
  local_2d8.p2.m_data[3] = 1.0;
  local_2d8.c2.m_data[0] = 1.0;
  local_2d8.c2.m_data[1] = 1.0;
  local_2d8.c2.m_data[2] = 1.0;
  local_2d8.c2.m_data[3] = 1.0;
  local_278 = &DAT_3f0000003f000000;
  uStack_270 = 0x3f80000000000000;
  local_268 = 0x3f8000003f800000;
  uStack_260 = 0x3f8000003f800000;
  local_258 = 0x3f00000047c35000;
  uStack_250 = 0x3f80000000000000;
  local_248 = 0x3f8000003f800000;
  uStack_240 = 0x3f8000003f800000;
  local_238 = 0x47c350003f000000;
  uStack_230 = 0x3f80000000000000;
  local_228 = 0x3f8000003f800000;
  uStack_220 = 0x3f8000003f800000;
  local_218 = 0xc7c35000bf666666;
  uStack_210 = 0x3f80000000000000;
  local_208 = 0x3f8000003f800000;
  uStack_200 = 0x3f8000003f800000;
  local_1f8 = 0xc7c35000bf8ccccd;
  uStack_1f0 = 0x3f80000000000000;
  local_1e8 = 0x3f8000003f800000;
  uStack_1e0 = 0x3f8000003f800000;
  local_1d8 = 0x47c35000bf666666;
  uStack_1d0 = 0x3f80000000000000;
  local_818.p0.m_data[0] = -0.2;
  local_818.p0.m_data[1] = -0.3;
  local_818.p0.m_data[2] = 0.0;
  local_818.p0.m_data[3] = 1.0;
  local_818.c0.m_data[0] = 1.0;
  local_818.c0.m_data[1] = 1.0;
  local_818.c0.m_data[2] = 1.0;
  local_818.c0.m_data[3] = 1.0;
  local_818.p1.m_data[0] = 0.2;
  local_818.p1.m_data[1] = -0.3;
  local_818.p1.m_data[2] = 0.0;
  local_818.p1.m_data[3] = 1.0;
  local_818.c1.m_data[0] = 1.0;
  local_818.c1.m_data[1] = 1.0;
  local_818.c1.m_data[2] = 1.0;
  local_818.c1.m_data[3] = 1.0;
  local_818.p2.m_data[0] = 0.0;
  local_818.p2.m_data[1] = -100000.0;
  local_818.p2.m_data[2] = 100000.0;
  local_818.p2.m_data[3] = 1.0;
  local_818.c2.m_data[0] = 1.0;
  local_818.c2.m_data[1] = 1.0;
  local_818.c2.m_data[2] = 1.0;
  local_818.c2.m_data[3] = 1.0;
  local_7b8 = &DAT_3f0000003f000000;
  uStack_7b0 = 0x3f80000000000000;
  local_7a8 = 0x3f8000003f800000;
  uStack_7a0 = 0x3f8000003f800000;
  local_798 = 0x474350003f666666;
  uStack_790 = 0x3f800000c7c35000;
  local_788 = 0x3f8000003f800000;
  uStack_780 = 0x3f8000003f800000;
  local_778 = 0x46c35000;
  uStack_770 = 0x3f800000c7c35000;
  local_768 = 0x3f8000003f800000;
  uStack_760 = 0x3f8000003f800000;
  local_758 = 0x46c35000bf666666;
  uStack_750 = 0x3f80000047c35000;
  local_458.p0.m_data[0] = -0.2;
  local_458.p0.m_data[1] = -0.3;
  local_458.p0.m_data[2] = 0.0;
  local_458.p0.m_data[3] = 1.0;
  local_458.c0.m_data[0] = 1.0;
  local_458.c0.m_data[1] = 0.0;
  local_458.c0.m_data[2] = 0.0;
  local_458.c0.m_data[3] = 1.0;
  local_458.p1.m_data[0] = 0.2;
  local_458.p1.m_data[1] = -0.3;
  local_458.p1.m_data[2] = 0.0;
  local_458.p1.m_data[3] = 1.0;
  local_458.c1.m_data[0] = 1.0;
  local_458.c1.m_data[1] = 1.0;
  local_458.c1.m_data[2] = 0.0;
  local_458.c1.m_data[3] = 1.0;
  local_458.p2.m_data[0] = 0.0;
  local_458.p2.m_data[1] = -100000.0;
  local_458.p2.m_data[2] = 2.0;
  local_458.p2.m_data[3] = 1.0;
  local_458.c2.m_data[0] = 0.0;
  local_458.c2.m_data[1] = 0.0;
  local_458.c2.m_data[2] = 1.0;
  local_458.c2.m_data[3] = 1.0;
  local_3f8 = 0x3f99999a3f19999a;
  uStack_3f0 = 0x3f80000000000000;
  local_3e8 = 0x3f800000;
  uStack_3e0 = 0x3f80000000000000;
  local_3d8 = 0x3f19999a3f99999a;
  uStack_3d0 = 0x3f80000000000000;
  local_3c8 = 0x3f8000003f800000;
  uStack_3c0 = 0x3f80000000000000;
  local_3b8 = 0x3f19999a3f19999a;
  uStack_3b0 = 0x3f80000000000000;
  local_3a8 = 0;
  uStack_3a0 = 0x3f8000003f800000;
  local_398 = 0xbf99999a3f19999a;
  uStack_390 = 0x3f80000000000000;
  local_388 = 0x3f800000;
  uStack_380 = 0x3f80000000000000;
  local_378 = 0xbf19999a3f99999a;
  uStack_370 = 0x3f80000000000000;
  local_368 = 0x3f8000003f800000;
  uStack_360 = 0x3f80000000000000;
  local_358 = 0xc119999a4119999a;
  uStack_350 = 0x4180000000000000;
  local_348 = 0;
  uStack_340 = 0x3f8000003f800000;
  local_338 = 0x46c35000bf666666;
  uStack_330 = 0x3f80000047c35000;
  local_748 = 0x3f8000003f800000;
  uStack_740 = 0x3f8000003f800000;
  local_738 = 0xc6c35000bf000000;
  uStack_730 = 0x3f800000c7c35000;
  local_328 = 0x3f800000;
  uStack_320 = 0x3f80000000000000;
  local_318 = 0xc6c35000bf000000;
  uStack_310 = 0x3f800000c7c35000;
  local_728 = 0x3f8000003f800000;
  uStack_720 = 0x3f8000003f800000;
  local_718 = 0x46c35000be4ccccd;
  uStack_710 = 0x3f80000047c35000;
  local_308 = 0x3f8000003f800000;
  uStack_300 = 0x3f80000000000000;
  local_2f8 = 0x46c35000be4ccccd;
  uStack_2f0 = 0x3f80000047c35000;
  local_5d8.c2.m_data[0] = 1.0;
  local_5d8.c2.m_data[1] = 1.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f8000003f800000;
  local_1c8 = 0x3f8000003f800000;
  uStack_1c0 = 0x3f8000003f800000;
  local_708 = 0x3f8000003f800000;
  uStack_700 = 0x3f8000003f800000;
  local_2e8 = 0;
  uStack_2e0 = 0x3f8000003f800000;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_clip_viewport_center",
             "polygon viewport clipping",&local_6f8,&local_578,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_clip_viewport_corner",
             "polygon viewport clipping",&local_6f8,&local_578,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_z_clip","polygon z clipping",
             &local_1b8,(TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_z_clip_viewport_center",
             "polygon z clipping",&local_1b8,(TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_z_clip_viewport_corner",
             "polygon z clipping",&local_1b8,(TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_clip_viewport_center",
             "polygon viewport clipping",&local_2d8,&local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_clip_viewport_corner",
             "polygon viewport clipping",&local_2d8,&local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_z_clip","polygon z clipping",
             &local_818,&local_6f8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_z_clip_viewport_center",
             "polygon z clipping",&local_818,&local_6f8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_z_clip_viewport_corner",
             "polygon z clipping",&local_818,&local_6f8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131d98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_attrib_clip","polygon clipping",
             &local_458,&local_2d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_attrib_clip_viewport_center",
             "polygon clipping",&local_458,&local_2d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"poly_attrib_clip_viewport_corner",
             "polygon clipping",&local_458,&local_2d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0x3f99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0x3f19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0x3f19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0xbf99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0xbf19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0xc119999a4119999a;
  uStack_5f0 = 0x4180000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = 0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = 9.6;
  local_5d8.p2.m_data[1] = 9.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 16.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = 1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = 0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -9.6;
  local_578.p2.m_data[1] = 9.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 16.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  local_518.p0.m_data[0] = -0.6;
  local_518.p0.m_data[1] = -1.2;
  local_518.p0.m_data[2] = 0.0;
  local_518.p0.m_data[3] = 1.0;
  local_518.c0.m_data[0] = 1.0;
  local_518.c0.m_data[1] = 0.0;
  local_518.c0.m_data[2] = 0.0;
  local_518.c0.m_data[3] = 1.0;
  local_518.p1.m_data[0] = -1.2;
  local_518.p1.m_data[1] = -0.6;
  local_518.p1.m_data[2] = 0.0;
  local_518.p1.m_data[3] = 1.0;
  local_518.c1.m_data[0] = 1.0;
  local_518.c1.m_data[1] = 1.0;
  local_518.c1.m_data[2] = 0.0;
  local_518.c1.m_data[3] = 1.0;
  local_518.p2.m_data[0] = -9.6;
  local_518.p2.m_data[1] = -9.6;
  local_518.p2.m_data[2] = 0.0;
  local_518.p2.m_data[3] = 16.0;
  local_518.c2.m_data[0] = 0.0;
  local_518.c2.m_data[1] = 0.0;
  local_518.c2.m_data[2] = 1.0;
  local_518.c2.m_data[3] = 1.0;
  local_4b8.p0.m_data[0] = -0.9;
  local_4b8.p0.m_data[1] = 0.225;
  local_4b8.p0.m_data[2] = 0.9;
  local_4b8.p0.m_data[3] = 1.0;
  local_4b8.c0.m_data[0] = 1.0;
  local_4b8.c0.m_data[1] = 0.0;
  local_4b8.c0.m_data[2] = 0.0;
  local_4b8.c0.m_data[3] = 1.0;
  local_4b8.p1.m_data[0] = -0.5;
  local_4b8.p1.m_data[1] = -0.225;
  local_4b8.p1.m_data[2] = -0.9;
  local_4b8.p1.m_data[3] = 1.0;
  local_4b8.c1.m_data[0] = 1.0;
  local_4b8.c1.m_data[1] = 1.0;
  local_4b8.c1.m_data[2] = 0.0;
  local_4b8.c1.m_data[3] = 1.0;
  local_4b8.p2.m_data[0] = -0.2;
  local_4b8.p2.m_data[1] = 0.225;
  local_4b8.p2.m_data[2] = 0.9;
  local_4b8.p2.m_data[3] = 1.0;
  local_4b8.c2.m_data[0] = 0.0;
  local_4b8.c2.m_data[1] = 0.0;
  local_4b8.c2.m_data[2] = 1.0;
  local_4b8.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_0","polygon clipping",&local_6f8
             ,&local_458,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_0_viewport_center",
             "polygon clipping",&local_6f8,&local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_0_viewport_corner",
             "polygon clipping",&local_6f8,&local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0x3f99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0x3f19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0x3f19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0xbf99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0xbf19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0xc119999a4119999a;
  uStack_5f0 = 0x4180000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = 0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = 9.6;
  local_5d8.p2.m_data[1] = 9.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 16.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = 1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = 0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -9.6;
  local_578.p2.m_data[1] = 9.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 16.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  local_518.p0.m_data[0] = -0.6;
  local_518.p0.m_data[1] = -1.2;
  local_518.p0.m_data[2] = 0.0;
  local_518.p0.m_data[3] = 1.0;
  local_518.c0.m_data[0] = 1.0;
  local_518.c0.m_data[1] = 0.0;
  local_518.c0.m_data[2] = 0.0;
  local_518.c0.m_data[3] = 1.0;
  local_518.p1.m_data[0] = -1.2;
  local_518.p1.m_data[1] = -0.6;
  local_518.p1.m_data[2] = 0.0;
  local_518.p1.m_data[3] = 1.0;
  local_518.c1.m_data[0] = 1.0;
  local_518.c1.m_data[1] = 1.0;
  local_518.c1.m_data[2] = 0.0;
  local_518.c1.m_data[3] = 1.0;
  local_518.p2.m_data[0] = -9.6;
  local_518.p2.m_data[1] = -9.6;
  local_518.p2.m_data[2] = 0.0;
  local_518.p2.m_data[3] = 16.0;
  local_518.c2.m_data[0] = 0.0;
  local_518.c2.m_data[1] = 0.0;
  local_518.c2.m_data[2] = 1.0;
  local_518.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_1","polygon clipping",&local_6f8
             ,&local_4b8,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_1_viewport_center",
             "polygon clipping",&local_6f8,&local_4b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_1_viewport_corner",
             "polygon clipping",&local_6f8,&local_4b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0x3f99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0x3f19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0x3f19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0xbf99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0xbf19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0xbf19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = 0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = 0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = 1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = 0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = 0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  local_518.p0.m_data[0] = -0.6;
  local_518.p0.m_data[1] = -1.2;
  local_518.p0.m_data[2] = 0.0;
  local_518.p0.m_data[3] = 1.0;
  local_518.c0.m_data[0] = 1.0;
  local_518.c0.m_data[1] = 0.0;
  local_518.c0.m_data[2] = 0.0;
  local_518.c0.m_data[3] = 1.0;
  local_518.p1.m_data[0] = -1.2;
  local_518.p1.m_data[1] = -0.6;
  local_518.p1.m_data[2] = 0.0;
  local_518.p1.m_data[3] = 1.0;
  local_518.c1.m_data[0] = 1.0;
  local_518.c1.m_data[1] = 1.0;
  local_518.c1.m_data[2] = 0.0;
  local_518.c1.m_data[3] = 1.0;
  local_518.p2.m_data[0] = -0.6;
  local_518.p2.m_data[1] = -0.6;
  local_518.p2.m_data[2] = 0.0;
  local_518.p2.m_data[3] = 1.0;
  local_518.c2.m_data[0] = 0.0;
  local_518.c2.m_data[1] = 0.0;
  local_518.c2.m_data[2] = 1.0;
  local_518.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_2","polygon clipping",&local_6f8
             ,&local_4b8,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_2_viewport_center",
             "polygon clipping",&local_6f8,&local_4b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_2_viewport_corner",
             "polygon clipping",&local_6f8,&local_4b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = -2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0xbf19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0x3f19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = -0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = -1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = -1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = -0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = -0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_3","polygon clipping",&local_6f8
             ,&local_518,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_3_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_3_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = 0.3;
  local_6f8.p0.m_data[1] = 0.2;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.3;
  local_6f8.p1.m_data[1] = -0.2;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.9;
  local_6f8.p2.m_data[1] = 0.0;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0xbf19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0x3f19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = -0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = -1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = -1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = -0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = -0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_4","polygon clipping",&local_6f8
             ,&local_518,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_4_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_4_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.3;
  local_6f8.p0.m_data[1] = 0.2;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = -0.3;
  local_6f8.p1.m_data[1] = -0.2;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = -0.9;
  local_6f8.p2.m_data[1] = 0.0;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0xbf19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0x3f19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = -0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = -1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = -1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = -0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = -0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_5","polygon clipping",&local_6f8
             ,&local_518,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_5_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_5_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = 0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = 0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = 0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0xbf19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0x3f19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = -0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = -1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = -1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = -0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = -0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_6","polygon clipping",&local_6f8
             ,&local_518,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_6_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_6_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = 0.6;
  local_6f8.p0.m_data[1] = 1.2;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 1.2;
  local_6f8.p1.m_data[1] = 0.6;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.6;
  local_6f8.p2.m_data[1] = 0.6;
  local_6f8.p2.m_data[2] = 0.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf99999a3f19999a;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf19999a3f99999a;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0xbf19999a3f19999a;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f99999a3f19999a;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0x3f19999a3f99999a;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f8000003f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f19999a3f19999a;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  local_5d8.p0.m_data[0] = -0.6;
  local_5d8.p0.m_data[1] = 1.2;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 1.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 0.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = -1.2;
  local_5d8.p1.m_data[1] = 0.6;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 1.0;
  local_5d8.c1.m_data[1] = 1.0;
  local_5d8.c1.m_data[2] = 0.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -0.6;
  local_5d8.p2.m_data[1] = 0.6;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -0.6;
  local_578.p0.m_data[1] = -1.2;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 0.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = -1.2;
  local_578.p1.m_data[1] = -0.6;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = -0.6;
  local_578.p2.m_data[1] = -0.6;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 0.0;
  local_578.c2.m_data[1] = 0.0;
  local_578.c2.m_data[2] = 1.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_7","polygon clipping",&local_6f8
             ,&local_518,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_7_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_7_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf800000bf800000;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f8000003f800000;
  uStack_680 = 0x3f8000003f800000;
  local_678 = 0xbf8000003f800000;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f8000003f800000;
  local_658 = 0x3f800000bf800000;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0x3f8000003f800000;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f800000bf800000;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0;
  uStack_620 = 0x3f8000003f800000;
  local_618 = 0xbf8000003f800000;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0;
  uStack_600 = 0x3f8000003f800000;
  local_5f8 = 0x3f8000003f800000;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_8","polygon clipping",&local_6f8
             ,&local_5d8,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_8_viewport_center",
             "polygon clipping",&local_6f8,&local_5d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_8_viewport_corner",
             "polygon clipping",&local_6f8,&local_5d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0x3f800000bf800000;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f800000;
  uStack_680 = 0x3f80000000000000;
  local_678 = 0xbf8000003f800000;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f800000;
  uStack_660 = 0x3f80000000000000;
  local_658 = 0x3f8000003f800000;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0x3f800000;
  uStack_640 = 0x3f80000000000000;
  local_638 = 0xbf800000bf800000;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0;
  uStack_620 = 0x3f8000003f800000;
  local_618 = 0xbf8000003f800000;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0;
  uStack_600 = 0x3f8000003f800000;
  local_5f8 = 0x3f800000bf800000;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0;
  uStack_5e0 = 0x3f8000003f800000;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_9","polygon clipping",&local_6f8
             ,&local_5d8,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_9_viewport_center",
             "polygon clipping",&local_6f8,&local_5d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_9_viewport_corner",
             "polygon clipping",&local_6f8,&local_5d8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf800000bf800000;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f8000003f800000;
  uStack_680 = 0x3f8000003f800000;
  local_678 = 0xbf8000003f800000;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f8000003f800000;
  local_658 = 0x3f800000bf800000;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0x3f8000003f800000;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f800000bf800000;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0xbf8000003f800000;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f8000003f800000;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0x3f800000;
  uStack_5e0 = 0x3f80000000000000;
  local_5d8.p0.m_data[0] = -1.0;
  local_5d8.p0.m_data[1] = -1.0;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 0.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 1.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 1.0;
  local_5d8.p1.m_data[1] = -1.0;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 0.0;
  local_5d8.c1.m_data[1] = 0.0;
  local_5d8.c1.m_data[2] = 1.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -1.0;
  local_5d8.p2.m_data[1] = 1.0;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_10","polygon clipping",
             &local_6f8,&local_578,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_10_viewport_center",
             "polygon clipping",&local_6f8,&local_578,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_10_viewport_corner",
             "polygon clipping",&local_6f8,&local_578,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f8.p0.m_data[0] = -0.2;
  local_6f8.p0.m_data[1] = -0.3;
  local_6f8.p0.m_data[2] = 0.0;
  local_6f8.p0.m_data[3] = 1.0;
  local_6f8.c0.m_data[0] = 1.0;
  local_6f8.c0.m_data[1] = 0.0;
  local_6f8.c0.m_data[2] = 0.0;
  local_6f8.c0.m_data[3] = 1.0;
  local_6f8.p1.m_data[0] = 0.2;
  local_6f8.p1.m_data[1] = -0.3;
  local_6f8.p1.m_data[2] = 0.0;
  local_6f8.p1.m_data[3] = 1.0;
  local_6f8.c1.m_data[0] = 1.0;
  local_6f8.c1.m_data[1] = 1.0;
  local_6f8.c1.m_data[2] = 0.0;
  local_6f8.c1.m_data[3] = 1.0;
  local_6f8.p2.m_data[0] = 0.0;
  local_6f8.p2.m_data[1] = -0.9;
  local_6f8.p2.m_data[2] = 2.0;
  local_6f8.p2.m_data[3] = 1.0;
  local_6f8.c2.m_data[0] = 0.0;
  local_6f8.c2.m_data[1] = 0.0;
  local_6f8.c2.m_data[2] = 1.0;
  local_6f8.c2.m_data[3] = 1.0;
  local_698 = 0xbf800000bf800000;
  uStack_690 = 0x3f80000000000000;
  local_688 = 0x3f8000003f800000;
  uStack_680 = 0x3f8000003f800000;
  local_678 = 0xbf8000003f800000;
  uStack_670 = 0x3f80000000000000;
  local_668 = 0x3f8000003f800000;
  uStack_660 = 0x3f8000003f800000;
  local_658 = 0x3f800000bf800000;
  uStack_650 = 0x3f80000000000000;
  local_648 = 0x3f8000003f800000;
  uStack_640 = 0x3f8000003f800000;
  local_638 = 0x3f800000bf800000;
  uStack_630 = 0x3f80000000000000;
  local_628 = 0x3f800000;
  uStack_620 = 0x3f80000000000000;
  local_618 = 0xbf8000003f800000;
  uStack_610 = 0x3f80000000000000;
  local_608 = 0x3f800000;
  uStack_600 = 0x3f80000000000000;
  local_5f8 = 0x3f8000003f800000;
  uStack_5f0 = 0x3f80000000000000;
  local_5e8 = 0x3f800000;
  uStack_5e0 = 0x3f80000000000000;
  local_5d8.p0.m_data[0] = -1.0;
  local_5d8.p0.m_data[1] = -1.0;
  local_5d8.p0.m_data[2] = 0.0;
  local_5d8.p0.m_data[3] = 1.0;
  local_5d8.c0.m_data[0] = 0.0;
  local_5d8.c0.m_data[1] = 0.0;
  local_5d8.c0.m_data[2] = 1.0;
  local_5d8.c0.m_data[3] = 1.0;
  local_5d8.p1.m_data[0] = 1.0;
  local_5d8.p1.m_data[1] = -1.0;
  local_5d8.p1.m_data[2] = 0.0;
  local_5d8.p1.m_data[3] = 1.0;
  local_5d8.c1.m_data[0] = 0.0;
  local_5d8.c1.m_data[1] = 0.0;
  local_5d8.c1.m_data[2] = 1.0;
  local_5d8.c1.m_data[3] = 1.0;
  local_5d8.p2.m_data[0] = -1.0;
  local_5d8.p2.m_data[1] = 1.0;
  local_5d8.p2.m_data[2] = 0.0;
  local_5d8.p2.m_data[3] = 1.0;
  local_5d8.c2.m_data[0] = 0.0;
  local_5d8.c2.m_data[1] = 0.0;
  local_5d8.c2.m_data[2] = 1.0;
  local_5d8.c2.m_data[3] = 1.0;
  local_578.p0.m_data[0] = -1.0;
  local_578.p0.m_data[1] = 1.0;
  local_578.p0.m_data[2] = 0.0;
  local_578.p0.m_data[3] = 1.0;
  local_578.c0.m_data[0] = 1.0;
  local_578.c0.m_data[1] = 1.0;
  local_578.c0.m_data[2] = 0.0;
  local_578.c0.m_data[3] = 1.0;
  local_578.p1.m_data[0] = 1.0;
  local_578.p1.m_data[1] = -1.0;
  local_578.p1.m_data[2] = 0.0;
  local_578.p1.m_data[3] = 1.0;
  local_578.c1.m_data[0] = 1.0;
  local_578.c1.m_data[1] = 1.0;
  local_578.c1.m_data[2] = 0.0;
  local_578.c1.m_data[3] = 1.0;
  local_578.p2.m_data[0] = 1.0;
  local_578.p2.m_data[1] = 1.0;
  local_578.p2.m_data[2] = 0.0;
  local_578.p2.m_data[3] = 1.0;
  local_578.c2.m_data[0] = 1.0;
  local_578.c2.m_data[1] = 1.0;
  local_578.c2.m_data[2] = 0.0;
  local_578.c2.m_data[3] = 1.0;
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_11","polygon clipping",
             &local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_11_viewport_center",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple_11_viewport_corner",
             "polygon clipping",&local_6f8,&local_518,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar1->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_02131e58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void PolysTestGroup::init (void)
{
	const float		large = 100000.0f;
	const float		offset = 0.9f;
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	// basic cases
	{
		const TriangleCase::TriangleData viewportPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.8f, -0.2f,  0.0f,  1.0f), white, tcu::Vec4(-0.8f,  0.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.3f,  0.05f,  0.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-1.1f,  0.6f,  0.0f,  1.0f), white, tcu::Vec4(-1.1f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f,  1.1f,  0.0f,  1.0f), white},
			{tcu::Vec4( 0.8f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4( 0.95f,-1.1f,  0.0f,  1.0f), white, tcu::Vec4( 3.0f,  0.0f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData depthPolys[] =
		{
			// one vertex clipped to Z+
			{tcu::Vec4(-0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.9f,  2.0f,  1.0f), white},

			// two vertices clipped to Z-
			{tcu::Vec4( 0.9f, 0.4f,  -1.5f,  1.0f), white, tcu::Vec4( 0.9f, -0.4f, -1.5f,  1.0f), white, tcu::Vec4( 0.6f,  0.0f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, 0.6f,  -2.0f,  1.0f), white, tcu::Vec4(-0.9f, -0.6f, -2.0f,  1.0f), white, tcu::Vec4(-0.4f,  0.0f,  2.0f,  1.0f), white},

			// three vertices clipped by X, Y and Z
			{tcu::Vec4( 0.0f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.5f,  -1.5f, 1.0f), white, tcu::Vec4( 1.2f, -0.9f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largePolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( large, 0.5f, 0.0f,  1.0f), white, tcu::Vec4( 0.5f,  large,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, -large, 0.0f,  1.0f), white, tcu::Vec4(-1.1f, -large, 0.0f,  1.0f), white, tcu::Vec4(-0.9f,  large,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largeDepthPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large, large,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( 0.9f, large/2, -large,  1.0f), white, tcu::Vec4( large/4, 0.0f, -large,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), white, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), white, tcu::Vec4(-0.2f, large/4, large,  1.0f), white},
		};
		const TriangleCase::TriangleData attribPolys[] =
		{
			// one vertex clipped to edge, large
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), blue},

			// two vertices clipped to edges
			{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

			// two vertices clipped to edges, with non-uniform w
			{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},

			// three vertices clipped, large, Z
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), red, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), yellow, tcu::Vec4(-0.2f, large/4, large,  1.0f), blue},
		};

		addChild(new TriangleCase(m_context, "poly_clip_viewport_center",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_clip_viewport_corner",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "poly_z_clip",							"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_center",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_corner",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_center",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_corner",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_z_clip",					"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_center",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_corner",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CORNER));

		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip",					"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CENTER));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CORNER));
	}

	// multiple polygons
	{
		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to edge
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},

				// three vertices clipped, Z
				{tcu::Vec4(-0.9f, offset/4, offset,  1.0f), red, tcu::Vec4(-0.5f, -offset/4, -offset,  1.0f), yellow, tcu::Vec4(-0.2f, offset/4, offset,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_0",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_1",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_2",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset, -2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_3",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4( 0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4( offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_4",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4(-0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4(-offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_5",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, 0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_6",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_7",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), blue,	tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_8",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,  tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_9",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,   tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_10",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,    tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,    tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), yellow, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), yellow, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), yellow},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_11",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}
	}
}